

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_x_6tap_32_avx2(uint8_t *src,__m256i *coeffs,__m256i *filt,int16_t *dst)

{
  __m256i src_00;
  __m256i src_01;
  undefined8 *in_RCX;
  __m256i d1;
  __m256i d0;
  __m256i r [2];
  __m256i *in_stack_fffffffffffffef8;
  __m256i *in_stack_ffffffffffffff00;
  __m256i *palVar1;
  __m256i *in_stack_ffffffffffffff08;
  __m256i *palVar2;
  uint8_t *in_stack_ffffffffffffff10;
  uint8_t *puVar3;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  x_convolve_6tap_32_avx2
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  src_00[1] = (longlong)in_stack_ffffffffffffff00;
  src_00[0] = (longlong)in_stack_fffffffffffffef8;
  src_00[2] = (longlong)in_stack_ffffffffffffff08;
  src_00[3] = (longlong)in_stack_ffffffffffffff10;
  palVar1 = in_stack_ffffffffffffff00;
  palVar2 = in_stack_ffffffffffffff08;
  puVar3 = in_stack_ffffffffffffff10;
  xy_x_round_avx2(src_00);
  src_01[1] = (longlong)palVar1;
  src_01[0] = uStack_e8;
  src_01[2] = (longlong)palVar2;
  src_01[3] = (longlong)puVar3;
  xy_x_round_avx2(src_01);
  *in_RCX = in_stack_ffffffffffffff00;
  in_RCX[1] = in_stack_ffffffffffffff08;
  in_RCX[2] = in_stack_ffffffffffffff10;
  in_RCX[3] = uStack_e8;
  in_RCX[4] = local_e0;
  in_RCX[5] = uStack_d8;
  in_RCX[6] = uStack_d0;
  in_RCX[7] = uStack_c8;
  return;
}

Assistant:

static inline void xy_x_6tap_32_avx2(const uint8_t *const src,
                                     const __m256i coeffs[3],
                                     const __m256i filt[3],
                                     int16_t *const dst) {
  __m256i r[2];

  x_convolve_6tap_32_avx2(src, coeffs, filt, r);
  const __m256i d0 = xy_x_round_avx2(r[0]);
  const __m256i d1 = xy_x_round_avx2(r[1]);
  _mm256_storeu_si256((__m256i *)dst, d0);
  _mm256_storeu_si256((__m256i *)(dst + 16), d1);
}